

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async_func_sig_return_test.c
# Opt level: O0

void long_async_func(int report_val)

{
  uint uVar1;
  pid_t pVar2;
  __pid_t _Var3;
  int iVar4;
  uint *puVar5;
  int *piVar6;
  char *pcVar7;
  int tmp_err;
  int report_val_local;
  
  _Var3 = fork();
  if (_Var3 == -1) {
    log_formatted("Cannot fork!");
    exit(1);
  }
  if (_Var3 == 0) {
    close(0);
    close(1);
    iVar4 = sigprocmask(1,(sigset_t *)&block_mask,(sigset_t *)0x0);
    if (iVar4 == -1) {
      log_formatted("Failed to restore sig handlers!");
    }
    pVar2 = main_pid;
    if (report_val != 0) {
      iVar4 = __libc_current_sigrtmin();
      iVar4 = kill(pVar2,iVar4 + 1);
      pVar2 = main_pid;
      if (iVar4 == -1) {
        puVar5 = (uint *)__errno_location();
        uVar1 = *puVar5;
        piVar6 = __errno_location();
        pcVar7 = strerror(*piVar6);
        log_formatted("Cannot send signal to parent %d: %d, %s",(ulong)(uint)pVar2,(ulong)uVar1,
                      pcVar7);
        exit(1);
      }
    }
    exit(0);
  }
  await_forks = await_forks + 1;
  return;
}

Assistant:

void long_async_func(int report_val) {
    int tmp_err = 0;

    switch (fork()) {
        case -1:
            log_formatted("Cannot fork!");
            exit(EXIT_FAILURE);
        case 0:
            close(0);
            close(1);
            tmp_err = sigprocmask(SIG_UNBLOCK, &block_mask, 0);
            if(tmp_err == -1) {
                log_formatted("Failed to restore sig handlers!");
            }
//            sleep(DELAY);

            // signal parent if necessary
            if(report_val) {
                tmp_err = kill(main_pid, NOTIFY_SIG);
                if(tmp_err == -1) {
                    log_formatted("Cannot send signal to parent %d: %d, %s", main_pid, errno, strerror(errno));
                    exit(EXIT_FAILURE);
                }
            }
            exit(EXIT_SUCCESS);
        default:
            await_forks++;
    }
}